

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O3

void __thiscall OpenMD::RigidBody::updateAtoms(RigidBody *this)

{
  double *pdVar1;
  double dVar2;
  Atom *pAVar3;
  bool bVar4;
  uint i;
  long lVar5;
  long *plVar6;
  undefined8 *puVar7;
  uint i_1;
  long lVar8;
  undefined8 *puVar9;
  double (*padVar10) [3];
  uint j;
  double (*padVar11) [3];
  uint k;
  long lVar12;
  ulong uVar13;
  SquareMatrix3<double> result_1;
  Vector3d ref;
  SquareMatrix3<double> result;
  RotMat3x3d a;
  double local_178 [10];
  Vector3d local_128;
  double local_108 [4];
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  double local_98;
  double dStack_90;
  undefined8 local_88;
  double local_78 [9];
  
  local_128.super_Vector<double,_3U>.data_[0] = 0.0;
  local_128.super_Vector<double,_3U>.data_[1] = 0.0;
  local_128.super_Vector<double,_3U>.data_[2] = 0.0;
  lVar8 = (long)(this->super_StuntDouble).localIndex_;
  lVar5 = *(long *)((long)&(((this->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData).
                           position.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                   (this->super_StuntDouble).storage_);
  local_108[2] = *(double *)(lVar5 + 0x10 + lVar8 * 0x18);
  pdVar1 = (double *)(lVar5 + lVar8 * 0x18);
  local_108[0] = *pdVar1;
  local_108[1] = pdVar1[1];
  StuntDouble::getA((RotMat3x3d *)local_78,&this->super_StuntDouble);
  if ((this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar13 = 0;
    do {
      StuntDouble::body2Lab
                (&local_128,&this->super_StuntDouble,
                 (this->refCoords_).
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar13);
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      lVar5 = 0;
      do {
        local_178[lVar5] = local_108[lVar5] + local_128.super_Vector<double,_3U>.data_[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      local_88 = local_178[2];
      local_98 = local_178[0];
      dStack_90 = local_178[1];
      pAVar3 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar13];
      lVar8 = (long)(pAVar3->super_StuntDouble).localIndex_;
      lVar5 = *(long *)((long)&(((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                               atomData).position.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                       + (pAVar3->super_StuntDouble).storage_);
      *(double *)(lVar5 + 0x10 + lVar8 * 0x18) = local_178[2];
      pdVar1 = (double *)(lVar5 + lVar8 * 0x18);
      *pdVar1 = local_178[0];
      pdVar1[1] = local_178[1];
      bVar4 = AtomType::isDirectional(pAVar3->atomType_);
      if (bVar4) {
        pAVar3 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar13];
        if (pAVar3 == (Atom *)0x0) {
          plVar6 = (long *)0x0;
        }
        else {
          plVar6 = (long *)__dynamic_cast(pAVar3,&Atom::typeinfo,&DirectionalAtom::typeinfo);
        }
        padVar10 = (double (*) [3])
                   ((this->refOrients_).
                    super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar13);
        local_b8 = 0;
        uStack_b0 = 0;
        local_c8 = 0;
        uStack_c0 = 0;
        local_d8 = 0;
        uStack_d0 = 0;
        local_e8 = 0;
        uStack_e0 = 0;
        local_a8 = 0;
        lVar5 = 0;
        puVar7 = &local_e8;
        do {
          lVar8 = 0;
          puVar9 = puVar7;
          do {
            *puVar9 = *(undefined8 *)
                       ((long)(((SquareMatrix<double,_3> *)*padVar10)->
                              super_RectMatrix<double,_3U,_3U>).data_ + lVar8 * 8);
            lVar8 = lVar8 + 1;
            puVar9 = puVar9 + 3;
          } while (lVar8 != 3);
          lVar5 = lVar5 + 1;
          puVar7 = puVar7 + 1;
          padVar10 = padVar10 + 1;
        } while (lVar5 != 3);
        local_178[6] = 0.0;
        local_178[7] = 0.0;
        local_178[4] = 0.0;
        local_178[5] = 0.0;
        local_178[2] = 0.0;
        local_178[3] = 0.0;
        local_178[0] = 0.0;
        local_178[1] = 0.0;
        local_178[8] = 0.0;
        lVar5 = 0;
        puVar7 = &local_e8;
        do {
          lVar8 = 0;
          padVar10 = (double (*) [3])local_78;
          do {
            dVar2 = local_178[lVar5 * 3 + lVar8];
            lVar12 = 0;
            padVar11 = padVar10;
            do {
              dVar2 = dVar2 + (double)puVar7[lVar12] *
                              (((SquareMatrix<double,_3> *)*padVar11)->
                              super_RectMatrix<double,_3U,_3U>).data_[0][0];
              lVar12 = lVar12 + 1;
              padVar11 = padVar11 + 1;
            } while (lVar12 != 3);
            local_178[lVar5 * 3 + lVar8] = dVar2;
            lVar8 = lVar8 + 1;
            padVar10 = (double (*) [3])(*padVar10 + 1);
          } while (lVar8 != 3);
          lVar5 = lVar5 + 1;
          puVar7 = puVar7 + 3;
        } while (lVar5 != 3);
        (**(code **)(*plVar6 + 0x18))(plVar6,local_178);
      }
      uVar13 = (ulong)((int)uVar13 + 1);
    } while (uVar13 < (ulong)((long)(this->atoms_).
                                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->atoms_).
                                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void RigidBody::updateAtoms() {
    unsigned int i;
    Vector3d ref;
    Vector3d apos;
    DirectionalAtom* dAtom;
    Vector3d pos = getPos();
    RotMat3x3d a = getA();

    for (i = 0; i < atoms_.size(); i++) {
      ref = body2Lab(refCoords_[i]);

      apos = pos + ref;

      atoms_[i]->setPos(apos);

      if (atoms_[i]->isDirectional()) {
        dAtom = dynamic_cast<DirectionalAtom*>(atoms_[i]);
        dAtom->setA(refOrients_[i].transpose() * a);
      }
    }
  }